

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

float duy(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  beaudet_t *pbVar6;
  beaudet_t *pbVar7;
  int iVar8;
  float fVar9;
  
  iVar5 = Ix.m / 2;
  iVar8 = iVar5 * 3 + p->ofst;
  fVar9 = 0.0;
  if ((-2 < Ix.m && y < p->sizx - iVar8) && ((iVar8 <= y && iVar8 <= x) && x < p->sizy - iVar8)) {
    iVar1 = -iVar5;
    iVar8 = iVar1;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    iVar2 = (y + (x - iVar5) * p->res) - iVar5;
    iVar4 = iVar8 + iVar5 + 1;
    pbVar6 = &Ix;
    iVar5 = iVar4;
    pbVar7 = pbVar6;
    iVar3 = iVar2;
    do {
      do {
        fVar9 = fVar9 + (*p->flow_ptr)[iVar2].x * pbVar6->g[0][0];
        pbVar6 = (beaudet_t *)(pbVar6->g + 1);
        iVar2 = iVar2 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar1 = iVar1 + 1;
      pbVar6 = (beaudet_t *)(pbVar7->g[0] + 1);
      iVar2 = iVar3 + p->res;
      iVar5 = iVar4;
      pbVar7 = pbVar6;
      iVar3 = iVar2;
    } while (iVar8 + 1 != iVar1);
  }
  return fVar9 / Ix.f;
}

Assistant:

float duy(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].x*Ix.g[j+h][i+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}